

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execClr<(moira::Instr)36,(moira::Mode)4,(moira::Size)1>(Moira *this,u16 opcode)

{
  int *piVar1;
  u32 addr;
  u32 uVar2;
  uint n;
  
  n = opcode & 7;
  addr = computeEA<(moira::Mode)4,(moira::Size)1,0ul>(this,n);
  readM<(moira::MemSpace)1,(moira::Size)1,64ul>(this,addr);
  piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
  *piVar1 = *piVar1 + (-1 - (uint)((~(uint)opcode & 7) == 0));
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,addr,0);
  (this->reg).sr.n = false;
  (this->reg).sr.z = true;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return;
}

Assistant:

void
Moira::execClr(u16 opcode)
{
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(2);
    writeOp <M,S, REVERSE | POLLIPL> (dst, ea, 0);

    reg.sr.n = 0;
    reg.sr.z = 1;
    reg.sr.v = 0;
    reg.sr.c = 0;
}